

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::MinimizeRecGroups::run(MinimizeRecGroups *this,Module *module)

{
  __node_base_ptr this_00;
  optional<wasm::(anonymous_namespace)::GroupClassInfo> *this_01;
  __node_base_ptr *pp_Var1;
  unordered_map<wasm::RecGroupShape,_unsigned_int,_std::hash<wasm::RecGroupShape>,_std::equal_to<wasm::RecGroupShape>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>_>
  *this_02;
  DisjointSets *this_03;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_04;
  pointer *ppRVar2;
  pointer *__return_storage_ptr__;
  RecGroupInfo *__args;
  pointer pRVar3;
  pointer this_05;
  pointer __first;
  pointer puVar4;
  pointer pHVar5;
  pointer pFVar6;
  bool bVar7;
  uint uVar8;
  Shareability share;
  HeapTypeKind HVar9;
  pointer __result;
  size_t sVar10;
  _Tp_alloc_type *p_Var11;
  pointer pRVar12;
  pointer pRVar13;
  pointer pRVar14;
  size_t sVar15;
  ulong uVar16;
  _Storage<wasm::HeapType,_true> _Var17;
  Type TVar18;
  Type TVar19;
  Struct *pSVar20;
  HeapType HVar21;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  mapped_type *pmVar22;
  _Tp_alloc_type *__alloc;
  size_t __n;
  pointer pHVar23;
  size_t __n_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_00;
  ulong elem2;
  uint uVar24;
  _Hash_node_base *p_Var25;
  pointer *__x_00;
  uint uVar26;
  int iVar27;
  GroupClassInfo *classInfo;
  undefined8 *puVar28;
  long lVar29;
  GroupClassInfo *this_06;
  __hashtable *__h;
  _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
  *this_07;
  RecGroupInfo *__args_00;
  pointer pFVar30;
  int iVar31;
  _Tp_alloc_type *p_Var32;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_false,_true>,_bool>
  pVar33;
  optional<wasm::HeapType> oVar34;
  Signature SVar35;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  undefined1 local_310 [8];
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
  publicGroups;
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  local_1f0 [56];
  uint uStack_1b8;
  undefined4 uStack_1b4;
  RecGroup group;
  _Hash_node_base _Stack_188;
  Module *local_140;
  undefined1 auStack_138 [8];
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  outputIndices;
  undefined1 local_c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  deps;
  Index other;
  Index index;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sccTypes;
  __hashtable *__h_1;
  HeapType local_40;
  Iterator __begin2;
  SCC scc;
  
  if (((module->features).features & 0x400) == 0) {
    return;
  }
  if ((wasm::(anonymous_namespace)::MinimizeRecGroups::initBrandOptions()::fieldsInitialized == '\0'
      ) && (iVar27 = __cxa_guard_acquire(&wasm::(anonymous_namespace)::MinimizeRecGroups::
                                          initBrandOptions()::fieldsInitialized), iVar27 != 0)) {
    wasm::(anonymous_namespace)::BrandTypeIterator::fieldOptions = 2;
    DAT_01175c68 = 0x100000001;
    DAT_01175c70 = 2;
    DAT_01175c78 = 0x100000002;
    _DAT_01175c80 = 2;
    _DAT_01175c88 = 0x100000000;
    _DAT_01175c90 = 3;
    _DAT_01175c98 = 0x100000000;
    _DAT_01175ca0 = 4;
    _DAT_01175ca8 = 0x100000000;
    _DAT_01175cb0 = 5;
    _DAT_01175cb8 = 0x100000000;
    _DAT_01175cc0 = 0x22;
    _DAT_01175cc8 = 0x100000000;
    _DAT_01175cd0 = 0x12;
    _DAT_01175cd8 = 0x100000000;
    _DAT_01175ce0 = 10;
    _DAT_01175ce8 = 0x100000000;
    _DAT_01175cf0 = 0x5a;
    _DAT_01175cf8 = 0x100000000;
    _DAT_01175d00 = 0x6a;
    _DAT_01175d08 = 0x100000000;
    _DAT_01175d10 = 0x62;
    _DAT_01175d18 = 0x100000000;
    _DAT_01175d20 = 0x20;
    _DAT_01175d28 = 0x100000000;
    _DAT_01175d30 = 0x10;
    _DAT_01175d38 = 0x100000000;
    _DAT_01175d40 = 8;
    _DAT_01175d48 = 0x100000000;
    _DAT_01175d50 = 0x58;
    _DAT_01175d58 = 0x100000000;
    _DAT_01175d60 = 0x68;
    _DAT_01175d68 = 0x100000000;
    _DAT_01175d70 = 0x60;
    _DAT_01175d78 = 0x100000000;
    __cxa_guard_release(&wasm::(anonymous_namespace)::MinimizeRecGroups::initBrandOptions()::
                         fieldsInitialized);
  }
  p_Var11 = (_Tp_alloc_type *)0x1;
  local_140 = module;
  wasm::ModuleUtils::collectHeapTypeInfo
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_310,module,
             AllTypes,FindVisibility);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
            (&this->types,(size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
  typeInfo.List.
  super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
  ._M_impl._M_node._M_size = (size_t)&publicGroups._M_h._M_rehash_policy._M_next_resize;
  publicGroups._M_h._M_buckets = (__buckets_ptr)0x1;
  publicGroups._M_h._M_bucket_count = 0;
  publicGroups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  publicGroups._M_h._M_element_count._0_4_ = 0x3f800000;
  publicGroups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  publicGroups._M_h._M_rehash_policy._4_4_ = 0;
  publicGroups._M_h._M_rehash_policy._M_next_resize = 0;
  pp_Var1 = &publicGroups._M_h._M_single_bucket;
  for (p_Var25 = typeInfo.Map._M_h._M_single_bucket;
      p_Var25 != (_Hash_node_base *)&typeInfo.Map._M_h._M_single_bucket; p_Var25 = p_Var25->_M_nxt)
  {
    this_00 = p_Var25 + 2;
    if (*(int *)((long)&p_Var25[3]._M_nxt + 4) == 2) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (&this->types,(value_type *)this_00);
      p_Var11 = (_Tp_alloc_type *)this_00->_M_nxt;
      publicGroups._M_h._M_single_bucket = (__node_base_ptr)p_Var11;
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->typeIndices,pp_Var1);
    }
    else {
      publicGroups._M_h._M_single_bucket =
           (__node_base_ptr)HeapType::getRecGroup((HeapType *)this_00);
      std::__detail::
      _Insert<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&typeInfo.List.
                   super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                   ._M_impl._M_node._M_size,(value_type *)pp_Var1);
    }
  }
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::reserve(&this->publicGroupTypes,(size_type)publicGroups._M_h._M_before_begin._M_nxt);
  this_02 = &this->groupShapeIndices;
  pp_Var1 = &publicGroups._M_h._M_single_bucket;
  for (puVar28 = (undefined8 *)publicGroups._M_h._M_bucket_count; puVar28 != (undefined8 *)0x0;
      puVar28 = (undefined8 *)*puVar28) {
    _uStack_1b8 = (_Hash_node_base *)puVar28[1];
    publicGroups._M_h._M_single_bucket = (__node_base_ptr)&stack0xfffffffffffffe48;
    _auStack_138 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
                   RecGroup::end((RecGroup *)&stack0xfffffffffffffe48);
    std::
    vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
    ::emplace_back<wasm::RecGroup::Iterator,wasm::RecGroup::Iterator>
              ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                *)&this->publicGroupTypes,(Iterator *)pp_Var1,(Iterator *)auStack_138);
    publicGroups._M_h._M_single_bucket =
         (__node_base_ptr)
         ((this->publicGroupTypes).
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1);
    pVar33 = std::
             _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                       ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)this_02,pp_Var1);
    if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                    ,0x196,
                    "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
    }
  }
  __x_00 = (pointer *)
           (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  pHVar23 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this_07 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             *)((long)pHVar23 - (long)__x_00 >> 3);
  if ((ulong)this_07 >> 0x37 != 0) {
    std::__throw_length_error("vector::reserve");
  }
  pRVar12 = (this->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
       *)((long)(this->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar12 >> 8) < this_07)
  {
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ::_M_allocate(this_07,(size_t)__x_00);
    std::
    vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ::_S_relocate((this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish,__result,p_Var11);
    this_05 = (this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ::_M_deallocate((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                     *)this_05,
                    (pointer)((long)(this->groups).
                                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)this_05 >> 8),__n);
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pRVar3 - (long)pRVar12) + (long)__result);
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_07;
    __x_00 = (pointer *)
             (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar23 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  publicGroups._M_h._M_single_bucket = (__node_base_ptr)__x_00;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            (local_1f0,__x_00,pHVar23,0,auStack_138,&stack0xfffffffffffffe48,&other);
  auStack_138 = (undefined1  [8])pp_Var1;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  ::Iterator::operator++((Iterator *)auStack_138);
  local_40.id = (uintptr_t)auStack_138;
  this_03 = &this->equivalenceClasses;
  this_04 = &this->shapesToUpdate;
LAB_00aa32fa:
  if ((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
       *)local_40.id ==
      (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
       *)0x0) {
    pp_Var1 = &publicGroups._M_h._M_single_bucket;
    TypeSCCs::~TypeSCCs((TypeSCCs *)pp_Var1);
    outputIndices._M_h._M_buckets = (__buckets_ptr)0x1;
    auStack_138 = (undefined1  [8])&outputIndices._M_h._M_rehash_policy._M_next_resize;
    outputIndices._M_h._M_bucket_count = 0;
    outputIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    outputIndices._M_h._M_element_count._0_4_ = 0x3f800000;
    outputIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    outputIndices._M_h._M_rehash_policy._4_4_ = 0;
    outputIndices._M_h._M_rehash_policy._M_next_resize = 0;
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar26 = 0;
    for (pRVar12 = (this->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar3;
        pRVar12 = pRVar12 + 1) {
      uVar16 = 0;
      while( true ) {
        pHVar23 = (pRVar12->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(pRVar12->group).
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pHVar23 >> 3) <= uVar16)
        break;
        if ((pRVar12->hasBrand != true) ||
           ((pRVar12->permutation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16] != 0)) {
          publicGroups._M_h._M_single_bucket = (__node_base_ptr)pHVar23[uVar16].id;
          std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)auStack_138,pp_Var1);
        }
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      uVar26 = uVar26 + (int)uVar16;
    }
    TypeBuilder::TypeBuilder((TypeBuilder *)&__begin2,(ulong)uVar26);
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar26 = 0;
    for (pRVar12 = (this->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar3;
        pRVar12 = pRVar12 + 1) {
      TypeBuilder::createRecGroup
                ((TypeBuilder *)&__begin2,(ulong)uVar26,
                 (long)(pRVar12->group).
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pRVar12->group).
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      pHVar5 = (pRVar12->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar23 = (pRVar12->group).
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_start; pHVar23 != pHVar5; pHVar23 = pHVar23 + 1) {
        local_40.id = pHVar23->id;
        _other = auStack_138;
        sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&__begin2;
        if (local_40.id <
            (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
             *)0x7d) {
          __assert_fail("!type.isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x2df,
                        "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)]"
                       );
        }
        oVar34 = HeapType::getDeclaredSuperType(&local_40);
        uVar16 = (ulong)uVar26;
        if (((undefined1  [16])
             oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          _Var17._M_value =
               rewriteTypes::anon_class_16_2_d318959e::operator()
                         ((anon_class_16_2_d318959e *)&other,
                          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var17;
          TypeBuilder::setSubType((TypeBuilder *)&__begin2,uVar16,oVar34);
        }
        oVar34 = HeapType::getDescriptorType(&local_40);
        if (((undefined1  [16])
             oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          _Var17._M_value =
               rewriteTypes::anon_class_16_2_d318959e::operator()
                         ((anon_class_16_2_d318959e *)&other,
                          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var17;
          TypeBuilder::setDescriptor((TypeBuilder *)&__begin2,uVar16,desc);
        }
        oVar34 = HeapType::getDescribedType(&local_40);
        if (((undefined1  [16])
             oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          _Var17._M_value =
               rewriteTypes::anon_class_16_2_d318959e::operator()
                         ((anon_class_16_2_d318959e *)&other,
                          oVar34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var17;
          TypeBuilder::setDescribed((TypeBuilder *)&__begin2,uVar16,desc_00);
        }
        bVar7 = HeapType::isOpen(&local_40);
        TypeBuilder::setOpen((TypeBuilder *)&__begin2,uVar16,bVar7);
        share = HeapType::getShared(&local_40);
        TypeBuilder::setShared((TypeBuilder *)&__begin2,uVar16,share);
        permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&__begin2;
        deps.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&other;
        local_c0 = (undefined1  [8])
                   &permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        HVar9 = HeapType::getKind(&local_40);
        switch(HVar9) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                             ,0x31b);
        case Func:
          SVar35 = HeapType::getSignature(&local_40);
          TVar18 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)local_c0,SVar35.params.id);
          TVar19 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)local_c0,SVar35.results.id);
          SVar35.results.id = TVar19.id;
          SVar35.params.id = TVar18.id;
          TypeBuilder::setHeapType((TypeBuilder *)&__begin2,uVar16,SVar35);
          break;
        case Struct:
          pSVar20 = HeapType::getStruct(&local_40);
          publicGroups._M_h._M_single_bucket = (__node_base_ptr)0x0;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &publicGroups._M_h._M_single_bucket,
                     (long)(pSVar20->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pSVar20->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4);
          pFVar6 = (pSVar20->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pFVar30 = (pSVar20->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start; pFVar30 != pFVar6; pFVar30 = pFVar30 + 1)
          {
            _uStack_1b8 = (_Hash_node_base *)(pFVar30->type).id;
            group.id._0_4_ = pFVar30->packedType;
            group.id._4_4_ = pFVar30->mutable_;
            _uStack_1b8 = (_Hash_node_base *)
                          TypeBuilder::
                          copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                          ::anon_class_16_2_ecc023e0::operator()
                                    ((anon_class_16_2_ecc023e0 *)local_c0,(Type)_uStack_1b8);
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                       &publicGroups._M_h._M_single_bucket,(value_type *)&stack0xfffffffffffffe48);
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xfffffffffffffe48,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &publicGroups._M_h._M_single_bucket);
          TypeBuilder::setHeapType
                    ((TypeBuilder *)&__begin2,uVar16,(Struct *)&stack0xfffffffffffffe48);
          std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                    ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &stack0xfffffffffffffe48);
          std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                    ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &publicGroups._M_h._M_single_bucket);
          break;
        case Array:
          HeapType::getArray((HeapType *)&publicGroups._M_h._M_single_bucket);
          publicGroups._M_h._M_single_bucket =
               (__node_base_ptr)
               TypeBuilder::
               copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
               ::anon_class_16_2_ecc023e0::operator()
                         ((anon_class_16_2_ecc023e0 *)local_c0,
                          (Type)publicGroups._M_h._M_single_bucket);
          TypeBuilder::setHeapType
                    ((TypeBuilder *)&__begin2,uVar16,(Array *)&publicGroups._M_h._M_single_bucket);
          break;
        case Cont:
          HVar21.id = (uintptr_t)HeapType::getContinuation(&local_40);
          HVar21 = rewriteTypes::anon_class_16_2_d318959e::operator()
                             ((anon_class_16_2_d318959e *)&other,HVar21);
          TypeBuilder::setHeapType((TypeBuilder *)&__begin2,uVar16,(Continuation)HVar21.id);
        }
        uVar26 = uVar26 + 1;
      }
    }
    TypeBuilder::build((BuildResult *)&other,(TypeBuilder *)&__begin2);
    if ((char)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)&other);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      _uStack_1b8 = &stack0xfffffffffffffe78;
      group.id = 1;
      _Stack_188._M_nxt = (_Hash_node_base *)0x0;
      pRVar3 = (this->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar27 = 0;
      for (pRVar12 = (this->groups).
                     super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar3;
          pRVar12 = pRVar12 + 1) {
        uVar16 = 0;
        while( true ) {
          puVar4 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          iVar31 = (int)uVar16;
          pHVar23 = (pRVar12->group).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(pRVar12->group).
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar23 >> 3) <=
              uVar16) break;
          if ((pRVar12->hasBrand != true) ||
             ((pRVar12->permutation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16] != 0)) {
            pmVar22 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&stack0xfffffffffffffe48,pHVar23 + uVar16);
            pmVar22->id = *(uintptr_t *)(puVar4 + (ulong)(uint)(iVar31 + iVar27) * 2);
          }
          uVar16 = (ulong)(iVar31 + 1);
        }
        iVar27 = iVar27 + iVar31;
      }
      GlobalTypeRewriter::GlobalTypeRewriter
                ((GlobalTypeRewriter *)&publicGroups._M_h._M_single_bucket,local_140);
      GlobalTypeRewriter::mapTypes
                ((GlobalTypeRewriter *)&publicGroups._M_h._M_single_bucket,
                 (TypeMap *)&stack0xfffffffffffffe48);
      GlobalTypeRewriter::mapTypeNamesAndIndices
                ((GlobalTypeRewriter *)&publicGroups._M_h._M_single_bucket,
                 (TypeMap *)&stack0xfffffffffffffe48);
      GlobalTypeRewriter::~GlobalTypeRewriter
                ((GlobalTypeRewriter *)&publicGroups._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&stack0xfffffffffffffe48);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           *)&other);
      TypeBuilder::~TypeBuilder((TypeBuilder *)&__begin2);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auStack_138);
      std::
      _Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&typeInfo.List.
                        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                        ._M_impl._M_node._M_size);
      InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::~InsertOrderedMap
                ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_310);
      return;
    }
    __assert_fail("built",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                  ,0x34b,
                  "void wasm::(anonymous namespace)::MinimizeRecGroups::rewriteTypes(Module &)");
  }
  __begin2.scc.parent = (SCC)(SCC)local_40.id;
  sVar10 = DisjointSets::addSet(this_03);
  deps.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar10;
  p_Var11 = (_Tp_alloc_type *)(sVar10 & 0xffffffff);
  __first = (this->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar14 = (this->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar29 = (long)pRVar14 - (long)__first;
  if (p_Var11 != (_Tp_alloc_type *)(lVar29 >> 8)) {
    __assert_fail("index == groups.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                  ,0x1a1,
                  "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
  }
  if (pRVar14 ==
      (this->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if (lVar29 == 0x7fffffffffffff00) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    __alloc = (_Tp_alloc_type *)0x1;
    p_Var32 = p_Var11;
    if (pRVar14 == __first) {
      p_Var32 = __alloc;
    }
    pRVar12 = std::
              _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                             *)(p_Var32 + (long)p_Var11),(size_t)__x_00);
    memset((void *)(lVar29 + (long)pRVar12),0,0x100);
    pRVar13 = std::
              vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ::_S_relocate(__first,pRVar14,pRVar12,__alloc);
    pRVar14 = std::
              vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ::_S_relocate(pRVar14,pRVar14,pRVar13 + 1,__alloc);
    std::
    _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ::_M_deallocate((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                     *)__first,
                    (pointer)((long)(this->groups).
                                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first >> 8),__n_00);
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pRVar12;
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar14;
    (this->groups).
    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar12 + (long)(p_Var32 + (long)p_Var11);
  }
  else {
    memset(pRVar14,0,0x100);
    ppRVar2 = &(this->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar2 = *ppRVar2 + 1;
  }
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  ::SCC::begin((Iterator *)&stack0xfffffffffffffe48,&__begin2.scc);
  _other = (unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
            *)0x0;
  sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputIndices._M_h._M_buckets = (__buckets_ptr)group.id;
  auStack_138 = (undefined1  [8])_uStack_1b8;
  __return_storage_ptr__ =
       &permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  types = extraout_RDX;
  while ((auStack_138 != (undefined1  [8])0x0 &&
         ((char)((RecGroup *)((long)auStack_138 + 0x90))->id == '\x01'))) {
    permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)outputIndices._M_h._M_buckets;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&other,
               (HeapType *)__return_storage_ptr__);
    SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
    ::SCC::Iterator::operator++((Iterator *)auStack_138);
    types = extraout_RDX_00;
  }
  createSubtypeGraph((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)__return_storage_ptr__,(anon_unknown_0 *)&other,types);
  TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)&stack0xfffffffffffffe48,
             __return_storage_ptr__);
  TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)auStack_138,_uStack_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputIndices._M_h._M_element_count);
  TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)auStack_138);
  TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)&stack0xfffffffffffffe48);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize
            (&(this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].group,
             (long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_start - _other >> 3);
  pRVar12 = (this->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar26 = 0; uVar16 = (ulong)uVar26,
      uVar16 < (ulong)((long)sccTypes.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_start - _other >> 3);
      uVar26 = uVar26 + 1) {
    pRVar12[-1].group.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start[uVar16].id =
         ((pointer)(_other + (ulong)*(uint *)((long)(TypeBuilder **)local_c0 + uVar16 * 4) * 8))->id
    ;
  }
  if ((this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    __assert_fail("shapesToUpdate.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                  ,0x1ad,
                  "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
  }
  __x_00 = (pointer *)
           ((long)&deps.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_04,(value_type_conflict2 *)__x_00);
LAB_00aa3563:
  do {
    puVar4 = (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start == puVar4) break;
    uVar26 = puVar4[-1];
    uVar16 = (ulong)uVar26;
    (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + -1;
    uStack_1b8 = uVar26;
    outputIndices._M_h._M_buckets._0_4_ = uVar26;
    auStack_138 = (undefined1  [8])
                  ((this->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16);
    __x_00 = (pointer *)auStack_138;
    pVar33 = std::
             _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                       ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)this_02);
    if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __args_00 = (this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar16;
      sVar10 = DisjointSets::getRoot(this_03,uVar16);
      uVar26 = *(uint *)((long)pVar33.first.
                               super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                               ._M_cur + 0x10);
      uVar16 = (ulong)uVar26;
      pRVar12 = (this->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = (uint)sVar10;
      deps.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = uVar26;
      if (uVar16 == 0xffffffff) {
        if (*(bool *)((long)&pRVar12[sVar10 & 0xffffffff].classInfo.
                             super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                             ._M_payload + 0xc0) == true) {
          this_06 = (GroupClassInfo *)&pRVar12[sVar10 & 0xffffffff].classInfo;
          GroupClassInfo::advance(this_06);
        }
        else {
          if (uStack_1b8 != uVar24) {
            __assert_fail("group == groupRep",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                          ,0x208,
                          "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)")
            ;
          }
          getCanonicalPermutation
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138,this,
                     &__args_00->group);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    (&__args_00->permutation,
                     (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
          this_06 = (GroupClassInfo *)&__args_00->classInfo;
          std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
          emplace<wasm::(anonymous_namespace)::RecGroupInfo&>
                    ((optional<wasm::(anonymous_namespace)::GroupClassInfo> *)this_06,__args_00);
        }
      }
      else {
        sVar15 = DisjointSets::getRoot(this_03,uVar16);
        elem2 = sVar10 & 0xffffffff;
        pRVar3 = (this->groups).
                 super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_06 = (GroupClassInfo *)&pRVar3[elem2].classInfo;
        bVar7 = *(bool *)((long)&pRVar3[elem2].classInfo.
                                 super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                                 ._M_payload + 0xc0);
        uVar8 = (uint)sVar15;
        if (uVar24 == uVar8) {
          if (bVar7 == false) {
            __assert_fail("groups[groupRep].classInfo",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                          ,0x218,
                          "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)")
            ;
          }
          GroupClassInfo::advanceBrand(this_06);
        }
        else {
          __args = pRVar12 + uVar16;
          uVar16 = sVar15 & 0xffffffff;
          if (bVar7 == false) {
            if (*(bool *)((long)&pRVar3[uVar16].classInfo.
                                 super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                                 ._M_payload + 0xc0) != true) {
              if ((uVar26 != uVar8) || (uStack_1b8 != uVar24)) {
                __assert_fail("group == groupRep && other == otherRep",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                              ,0x265,
                              "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                             );
              }
              std::
              _Hashtable<wasm::RecGroupShape,_std::pair<const_wasm::RecGroupShape,_unsigned_int>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::RecGroupShape>,_std::hash<wasm::RecGroupShape>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::erase(&this_02->_M_h,
                      (_Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                      )pVar33.first.
                       super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                       ._M_cur);
              getCanonicalPermutation
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138,this,
                         &__args_00->group);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                        (&__args->permutation,auStack_138);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&__args_00->permutation,&__args->permutation);
              this_01 = &__args->classInfo;
              std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
              emplace<wasm::(anonymous_namespace)::RecGroupInfo&>(this_01,__args);
              GroupClassInfo::permute((GroupClassInfo *)this_01,__args);
              GroupClassInfo::permute((GroupClassInfo *)this_01,__args_00);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this_04,&stack0xfffffffffffffe48);
              __x_00 = &deps.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this_04,(value_type_conflict2 *)__x_00);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_138);
              goto LAB_00aa3563;
            }
            sVar10 = DisjointSets::getUnion(this_03,uVar16,elem2);
            if (uVar8 != (uint)sVar10) {
              __assert_fail("otherRep == unionRep",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                            ,0x254,
                            "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                           );
            }
            std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                      ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                       &__args_00->classInfo);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&__args_00->permutation,&__args->permutation);
            this_06 = (GroupClassInfo *)&pRVar3[uVar16].classInfo;
            GroupClassInfo::advance(this_06);
          }
          else {
            if (*(bool *)((long)&pRVar3[uVar16].classInfo.
                                 super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                                 ._M_payload + 0xc0) != true) {
              sVar10 = DisjointSets::getUnion(this_03,elem2,uVar16);
              if (uVar24 != (uint)sVar10) {
                __assert_fail("groupRep == unionRep",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                              ,0x23f,
                              "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                             );
              }
              std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                        ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                         &__args->classInfo);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&__args->permutation,&__args_00->permutation);
            }
            GroupClassInfo::advance(this_06);
          }
        }
      }
      GroupClassInfo::permute(this_06,__args_00);
      __x_00 = (pointer *)&stack0xfffffffffffffe48;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this_04,(value_type_conflict2 *)__x_00);
    }
  } while( true );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&other);
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  ::Iterator::operator++((Iterator *)&local_40);
  goto LAB_00aa32fa;
}

Assistant:

void run(Module* module) override {
    // There are no recursion groups to minimize if GC is not enabled.
    if (!module->features.hasGC()) {
      return;
    }

    initBrandOptions();

    auto typeInfo = ModuleUtils::collectHeapTypeInfo(
      *module,
      ModuleUtils::TypeInclusion::AllTypes,
      ModuleUtils::VisibilityHandling::FindVisibility);

    types.reserve(typeInfo.size());

    // We cannot optimize public types, but we do need to make sure we don't
    // generate new groups with the same shape.
    std::unordered_set<RecGroup> publicGroups;
    for (auto& [type, info] : typeInfo) {
      if (info.visibility == ModuleUtils::Visibility::Private) {
        // We can optimize private types.
        types.push_back(type);
        typeIndices.insert({type, typeIndices.size()});
      } else {
        publicGroups.insert(type.getRecGroup());
      }
    }

    publicGroupTypes.reserve(publicGroups.size());
    for (auto group : publicGroups) {
      publicGroupTypes.emplace_back(group.begin(), group.end());
      [[maybe_unused]] auto [_, inserted] = groupShapeIndices.insert(
        {RecGroupShape(publicGroupTypes.back()), PublicGroupIndex});
      assert(inserted);
    }

    // The number of types to optimize is an upper bound on the number of
    // recursion groups we will emit.
    groups.reserve(types.size());

    // Compute the strongly connected components and ensure they form distinct
    // recursion groups.
    for (auto scc : TypeSCCs(types)) {
      [[maybe_unused]] Index index = equivalenceClasses.addSet();
      assert(index == groups.size());
      groups.emplace_back();

      // The SCC is not necessarily topologically sorted to have the supertypes
      // come first. Fix that.
      std::vector<HeapType> sccTypes(scc.begin(), scc.end());
      auto deps = createSubtypeGraph(sccTypes);
      auto permutation = *TopologicalOrders(deps).begin();
      groups.back().group.resize(sccTypes.size());
      for (Index i = 0; i < sccTypes.size(); ++i) {
        groups.back().group[i] = sccTypes[permutation[i]];
      }
      assert(shapesToUpdate.empty());
      shapesToUpdate.push_back(index);
      updateShapes();
    }

    rewriteTypes(*module);
  }